

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

string * __thiscall
FileSystemUtils::Path::Extension_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  ulong uVar2;
  string asStack_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = HasExtension(this);
  if (bVar1) {
    uVar2 = std::__cxx11::string::rfind((char)&this->m_string,0x2e);
    if (uVar2 < (this->m_string)._M_string_length) {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)&this->m_string);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
      std::__cxx11::string::~string(asStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Path::Extension()			const
	{
		std::string ext;
		if( HasExtension() )
		{
			size_t pos = m_string.find_last_of( '.' );
			if( pos < m_string.length() )
			{
				ext = m_string.substr( pos );
			}
		}
		return ext;
	}